

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  FilePath dir;
  
  if ((directory->pathname_)._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)relative_path);
  }
  else {
    RemoveTrailingPathSeparator((FilePath *)&dir.pathname_,directory);
    std::operator+(&bStack_78,&dir.pathname_,'/');
    std::operator+(&local_58,&bStack_78,&relative_path->pathname_);
    FilePath(__return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&dir);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty()) return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}